

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendHexWithPadding
          (MinimalFormatter *this,uint64 number,int width)

{
  char local_31;
  long local_30;
  int64 delta;
  char *start;
  uint64 uStack_18;
  int width_local;
  uint64 number_local;
  MinimalFormatter *this_local;
  
  delta = (int64)this->cursor_;
  start._4_4_ = width;
  uStack_18 = number;
  number_local = (uint64)this;
  AppendString(this,"0x");
  AppendUint64(this,uStack_18,0x10);
  if (this->cursor_ < (char *)(delta + start._4_4_)) {
    local_30 = (delta + start._4_4_) - (long)this->cursor_;
    std::copy<char*,char*>((char *)delta,this->cursor_,(char *)(delta + local_30));
    local_31 = ' ';
    std::fill<char*,char>((char *)delta,(char *)(delta + local_30),&local_31);
    this->cursor_ = (char *)(delta + start._4_4_);
  }
  return;
}

Assistant:

void AppendHexWithPadding(uint64 number, int width) {
    char* start = cursor_;
    AppendString("0x");
    AppendUint64(number, 16);
    // Move to right and add padding in front if needed.
    if (cursor_ < start + width) {
      const int64 delta = start + width - cursor_;
      std::copy(start, cursor_, start + delta);
      std::fill(start, start + delta, ' ');
      cursor_ = start + width;
    }
  }